

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Index __thiscall wabt::anon_unknown_1::WatWriter::GetLabelArity(WatWriter *this,Var *var)

{
  void *__s2;
  size_t __n;
  pointer *ppLVar1;
  uint uVar2;
  int iVar3;
  long in_RDX;
  WriteWatOptions **ppWVar4;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *pvVar5;
  long lVar6;
  
  if (*(int *)(in_RDX + 0x20) == 0) {
    uVar2 = (int)((ulong)((long)var - (long)this) >> 3) * -0x45d1745d;
    if (*(uint *)(in_RDX + 0x28) < uVar2) {
      ppWVar4 = &this->options_ + (ulong)(~*(uint *)(in_RDX + 0x28) + uVar2) * 0xb;
LAB_00f681eb:
      if (ppWVar4 != (WriteWatOptions **)0x0) {
        ppLVar1 = (pointer *)(ppWVar4 + 5);
        pvVar5 = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  *)(ppWVar4 + 6);
        if (((Result *)(ppWVar4 + 4))->enum_ != 2) {
          pvVar5 = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    *)(ppWVar4 + 9);
          ppLVar1 = (pointer *)(ppWVar4 + 8);
        }
        return (Index)((ulong)((long)(pvVar5->
                                     super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                     )._M_impl.super__Vector_impl_data._M_start - (long)*ppLVar1) >>
                      2);
      }
    }
  }
  else {
    if (*(int *)(in_RDX + 0x20) != 1) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                    ,0x36,"Index wabt::Var::index() const");
    }
    uVar2 = (int)((ulong)((long)var - (long)this) >> 3) * -0x45d1745d;
    if (uVar2 != 0) {
      __s2 = *(void **)(in_RDX + 0x28);
      __n = *(size_t *)(in_RDX + 0x30);
      lVar6 = (ulong)uVar2 * 0x58;
      do {
        if ((*(size_t *)((long)this + lVar6 + -0x50) == __n) &&
           ((__n == 0 || (iVar3 = bcmp(*(void **)((long)this + lVar6 + -0x58),__s2,__n), iVar3 == 0)
            ))) {
          ppWVar4 = (WriteWatOptions **)((long)this + lVar6 + -0x58);
          goto LAB_00f681eb;
        }
        lVar6 = lVar6 + -0x58;
      } while (lVar6 != 0);
    }
  }
  return 0;
}

Assistant:

Index WatWriter::GetLabelArity(const Var& var) {
  Label* label = GetLabel(var);
  if (!label) {
    return 0;
  }

  return label->label_type == LabelType::Loop ? label->param_types.size()
                                              : label->result_types.size();
}